

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_RemoveSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *this;
  VMValue *pVVar2;
  TObjPtr<AActor> *this_00;
  AActor *pAVar3;
  bool bVar4;
  bool local_77;
  FName local_74;
  AActor *local_70;
  AActor *mo;
  TThinkerIterator<AActor> it;
  PClassActor *pPStack_48;
  FName species;
  MetaClass *filter;
  int flags;
  bool removeall;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1899,
                  "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    this = (AActor *)(param->field_0).field_1.a;
    local_77 = true;
    if (this != (AActor *)0x0) {
      local_77 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_77 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1899,
                    "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 2) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189a,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      iVar1 = (pVVar2->field_0).i;
    }
    else {
      if (param[1].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189a,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[1].field_0.i;
    }
    if (numparam < 3) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189b,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      filter._0_4_ = (pVVar2->field_0).i;
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189b,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter._0_4_ = param[2].field_0.i;
    }
    if (numparam < 4) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      bVar4 = false;
      if ((pVVar2->field_0).field_3.Type == '\x03') {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        bVar4 = true;
        if ((pVVar2->field_0).field_1.atag != 1) {
          pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
          bVar4 = (pVVar2->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar4) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189c,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      pPStack_48 = (PClassActor *)(pVVar2->field_0).field_1.a;
    }
    else {
      bVar4 = false;
      if ((param[3].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, param[3].field_0.field_1.atag != 1)) {
        bVar4 = param[3].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189c,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pPStack_48 = (PClassActor *)param[3].field_0.field_1.a;
    }
    FName::FName((FName *)&it.super_FThinkerIterator.field_0x14);
    if (numparam < 5) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189d,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      FName::operator=((FName *)&it.super_FThinkerIterator.field_0x14,(pVVar2->field_0).i);
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189d,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FName::operator=((FName *)&it.super_FThinkerIterator.field_0x14,param[4].field_0.i);
    }
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&mo,0x80);
    bVar4 = TObjPtr<AActor>::operator!=(&this->master,(AActor *)0x0);
    if (bVar4) {
      while (local_70 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&mo,false),
            local_70 != (AActor *)0x0) {
        this_00 = &local_70->master;
        pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->master);
        bVar4 = TObjPtr<AActor>::operator==(this_00,pAVar3);
        pAVar3 = local_70;
        if (((bVar4) && (local_70 != this)) && ((local_70->health < 1 || (iVar1 != 0)))) {
          FName::FName(&local_74,(FName *)&it.super_FThinkerIterator.field_0x14);
          DoRemove(pAVar3,(int)filter,pPStack_48,&local_74);
        }
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1899,
                "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(removeall);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ((mo = it.Next()) != NULL)
		{
			if (mo->master == self->master && mo != self && (mo->health <= 0 || removeall))
			{
				DoRemove(mo, flags, filter, species);
			}
		}
	}
	return 0;
}